

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.hpp
# Opt level: O2

ostream * operator<<(ostream *stream,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *vector)

{
  pointer pbVar1;
  ostream *poVar2;
  pointer pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  string asStack_48 [32];
  
  std::operator<<(stream,"{");
  pbVar1 = (vector->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (vector->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    std::__cxx11::string::string(asStack_48,(string *)pbVar3);
    poVar2 = std::operator<<(stream,asStack_48);
    std::operator<<(poVar2," ");
    std::__cxx11::string::~string(asStack_48);
  }
  std::operator<<(stream,"}");
  return stream;
}

Assistant:

std::ostream& operator <<(std::ostream& stream, const std::vector<Type>& vector)
{
  stream << "{";
  for(Type value: vector)
    stream << value << " ";
  stream << "}";
  return stream;
}